

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O0

alias_tensor_instance * __thiscall
dlib::alias_tensor::operator()(alias_tensor *this,tensor *t,size_t offset)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  ostream *poVar4;
  ostream *poVar5;
  string *a;
  undefined8 uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ulong in_RCX;
  tensor *in_RDX;
  alias_tensor *in_RSI;
  alias_tensor_instance *in_RDI;
  ostringstream dlib_o_out;
  alias_tensor_instance *in_stack_fffffffffffffd58;
  alias_tensor_instance *in_stack_fffffffffffffd60;
  error_type t_00;
  ostringstream local_198 [376];
  ulong local_20;
  tensor *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  sVar2 = size(in_RSI);
  sVar3 = tensor::size(local_18);
  if (sVar3 < in_RCX + sVar2) {
    dlib_assert_breakpoint();
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar4 = std::operator<<((ostream *)local_198,"\n\nError detected at line ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x272);
    std::operator<<(poVar4,".\n");
    poVar4 = std::operator<<((ostream *)local_198,"Error detected in file ");
    poVar4 = std::operator<<(poVar4,
                             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/../dlib/cuda/tensor.h"
                            );
    std::operator<<(poVar4,".\n");
    poVar4 = std::operator<<((ostream *)local_198,"Error detected in function ");
    poVar4 = std::operator<<(poVar4,
                             "alias_tensor_instance dlib::alias_tensor::operator()(tensor &, size_t) const"
                            );
    std::operator<<(poVar4,".\n\n");
    poVar4 = std::operator<<((ostream *)local_198,"Failing expression was ");
    poVar4 = std::operator<<(poVar4,"offset+size() <= t.size()");
    std::operator<<(poVar4,".\n");
    poVar4 = (ostream *)std::ostream::operator<<(local_198,std::boolalpha);
    poVar4 = std::operator<<(poVar4,"offset: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_20);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar4 = std::operator<<(poVar4,"size(): ");
    sVar2 = size(in_RSI);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar2);
    poVar4 = std::operator<<(poVar4,"\n");
    poVar5 = std::operator<<(poVar4,"t.size(): ");
    sVar2 = tensor::size(local_18);
    a = (string *)std::ostream::operator<<(poVar5,sVar2);
    t_00 = (error_type)((ulong)poVar5 >> 0x20);
    poVar5 = std::operator<<((ostream *)a,"\n");
    std::operator<<(poVar5,"\n");
    uVar6 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error((fatal_error *)poVar4,t_00,a);
    __cxa_throw(uVar6,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  iVar1 = (*local_18->_vptr_tensor[10])();
  (in_RSI->inst).data_instance = (gpu_data *)CONCAT44(extraout_var,iVar1);
  iVar1 = (*local_18->_vptr_tensor[9])();
  (in_RSI->inst)._annotation = (any *)CONCAT44(extraout_var_00,iVar1);
  iVar1 = (*local_18->_vptr_tensor[0xc])();
  (in_RSI->inst).data_offset = CONCAT44(extraout_var_01,iVar1) + local_20;
  alias_tensor_instance::alias_tensor_instance(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  return in_RDI;
}

Assistant:

alias_tensor_instance operator() (
            tensor& t,
            size_t offset = 0
        ) const
        {
            DLIB_CASSERT(offset+size() <= t.size(), 
                "offset: "<<offset <<"\n"<<
                "size(): "<<size() <<"\n"<<
                "t.size(): "<<t.size() <<"\n");

#ifdef DLIB_USE_CUDA
            if (!inst.cudnn_descriptor)
            {
                inst.cudnn_descriptor = std::make_shared<cuda::tensor_descriptor>();
                inst.cudnn_descriptor->set_size(inst.m_n, inst.m_k, inst.m_nr, inst.m_nc);
            }
#endif
            inst.data_instance = &t.data();
            inst._annotation   = &t.annotation();
            // Note that t might already be an aliasing tensor so we need to take that into
            // account.
            inst.data_offset = t.get_alias_offset()+offset;
            return inst;
        }